

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_removeEquivalenceBothParametersNullptr_Test::TestBody
          (Variable_removeEquivalenceBothParametersNullptr_Test *this)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult local_88 [2];
  AssertHelper local_68 [8];
  Message local_60 [24];
  shared_ptr<libcellml::Variable> local_48;
  shared_ptr<libcellml::Variable> local_38;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  Variable_removeEquivalenceBothParametersNullptr_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_38,(nullptr_t)0x0);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_48,(nullptr_t)0x0);
  bVar1 = libcellml::Variable::removeEquivalence((shared_ptr *)&local_38,(shared_ptr *)&local_48);
  local_21 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_48);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_38);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar2) {
    testing::Message::Message(local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_88,local_20,"libcellml::Variable::removeEquivalence(nullptr, nullptr)","true");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x585,pcVar3);
    testing::internal::AssertHelper::operator=(local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    std::__cxx11::string::~string((string *)local_88);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(Variable, removeEquivalenceBothParametersNullptr)
{
    EXPECT_FALSE(libcellml::Variable::removeEquivalence(nullptr, nullptr));
}